

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int lj_record_next(jit_State *J,RecordIndex *ix)

{
  IRType IVar1;
  IRType t_00;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  TRef idx;
  TRef trvk;
  IRType tval;
  IRType tkey;
  IRType t;
  RecordIndex *ix_local;
  jit_State *J_local;
  
  IVar1 = rec_next_types((GCtab *)((ix->tabv).u64 & 0x7fffffffffff),(ix->keyv).u32.lo);
  t_00 = IVar1 & IRT_T;
  TVar2 = lj_ir_call(J,IRCALL_lj_vm_next,(ulong)ix->tab,(ulong)ix->key);
  if ((ix->mobj != 0) || (t_00 == IRT_NIL)) {
    (J->fold).ins.field_0.ot = 0x1013;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar3 = lj_opt_fold(J);
    if (ix->mobj == 0) {
      TVar4 = lj_ir_kint(J,-1);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold(J);
    }
    ix->mobj = TVar3;
  }
  TVar3 = lj_record_vload(J,TVar2,1,t_00);
  ix->key = TVar3;
  if ((t_00 == IRT_NIL) || (ix->idxchain != 0)) {
    ix->val = 0x7fff;
    J_local._4_4_ = 1;
  }
  else {
    TVar2 = lj_record_vload(J,TVar2,0,IVar1 >> 8);
    ix->val = TVar2;
    J_local._4_4_ = 2;
  }
  return J_local._4_4_;
}

Assistant:

int lj_record_next(jit_State *J, RecordIndex *ix)
{
  IRType t, tkey, tval;
  TRef trvk;
  t = rec_next_types(tabV(&ix->tabv), ix->keyv.u32.lo);
  tkey = (t & 0xff); tval = (t >> 8);
  trvk = lj_ir_call(J, IRCALL_lj_vm_next, ix->tab, ix->key);
  if (ix->mobj || tkey == IRT_NIL) {
    TRef idx = emitir(IRTI(IR_HIOP), trvk, trvk);
    /* Always check for invalid key from next() for nil result. */
    if (!ix->mobj) emitir(IRTGI(IR_NE), idx, lj_ir_kint(J, -1));
    ix->mobj = idx;
  }
  ix->key = lj_record_vload(J, trvk, 1, tkey);
  if (tkey == IRT_NIL || ix->idxchain) {  /* Omit value type check. */
    ix->val = TREF_NIL;
    return 1;
  } else {  /* Need value. */
    ix->val = lj_record_vload(J, trvk, 0, tval);
    return 2;
  }
}